

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

size_t __thiscall
kj::Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
::eraseRange<0ul,char_const(&)[4],char_const(&)[4]>
          (Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
           *this,char (*begin) [4],char (*end) [4])

{
  size_t sVar1;
  undefined1 local_a8 [24];
  NodeUnion *local_90;
  Leaf *pLStack_88;
  uint local_80;
  undefined4 uStack_7c;
  long local_70;
  long local_68;
  Iterator local_60;
  Iterator local_48;
  
  local_70 = *(long *)this;
  local_68 = *(long *)(this + 8) - local_70 >> 5;
  local_a8._0_8_ = &PTR_search_002373c8;
  local_a8._8_8_ = (Leaf *)(this + 0x20);
  local_a8._16_8_ = &local_70;
  local_90 = (NodeUnion *)begin;
  _::BTreeImpl::search(&local_48,(BTreeImpl *)(this + 0x28),(SearchKey *)local_a8);
  local_70 = *(long *)this;
  local_68 = *(long *)(this + 8) - local_70 >> 5;
  local_a8._0_8_ = &PTR_search_002373c8;
  local_a8._8_8_ = (Leaf *)(this + 0x20);
  local_a8._16_8_ = &local_70;
  local_90 = (NodeUnion *)end;
  _::BTreeImpl::search(&local_60,(BTreeImpl *)(this + 0x28),(SearchKey *)local_a8);
  local_90 = local_60.tree;
  pLStack_88 = local_60.leaf;
  local_80 = local_60.row;
  uStack_7c = local_60._20_4_;
  local_a8._0_8_ = local_48.tree;
  local_a8._8_8_ = local_48.leaf;
  local_a8._16_8_ = local_48._16_8_;
  sVar1 = eraseAllImpl<kj::_::IterRange<kj::_::BTreeImpl::Iterator>&>
                    (this,(IterRange<kj::_::BTreeImpl::Iterator> *)local_a8);
  return sVar1;
}

Assistant:

size_t Table<Row, Indexes...>::eraseRange(BeginKey&& begin, EndKey&& end) {
  auto inner = _::iterRange(get<index>(indexes).seek(rows.asPtr(), kj::fwd<BeginKey>(begin)),
                            get<index>(indexes).seek(rows.asPtr(), kj::fwd<EndKey>(end)));
  return eraseAllImpl(inner);
}